

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.hpp
# Opt level: O1

void __thiscall QpSolution::QpSolution(QpSolution *this,Instance *instance)

{
  allocator_type local_32;
  allocator_type local_31;
  
  QpVector::QpVector(&this->primal,instance->num_var);
  QpVector::QpVector(&this->rowactivity,instance->num_con);
  QpVector::QpVector(&this->dualvar,instance->num_var);
  QpVector::QpVector(&this->dualcon,instance->num_con);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_var,(long)instance->num_var,&local_31);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_con,(long)instance->num_con,&local_32);
  return;
}

Assistant:

QpSolution(Instance& instance)
      : primal(QpVector(instance.num_var)),
        rowactivity(QpVector(instance.num_con)),
        dualvar(instance.num_var),
        dualcon(instance.num_con),
        status_var(instance.num_var),
        status_con(instance.num_con) {}